

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O2

void CSOAA::do_actual_learning<true>(ldf *data,single_learner *base,multi_ex *ec_seq_all)

{
  v_array<v_array<ACTION_SCORE::action_score>_> *this;
  undefined8 *puVar1;
  undefined4 *puVar2;
  pointer ppeVar3;
  action_score *paVar4;
  v_array<ACTION_SCORE::action_score> *pvVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  action_score *paVar9;
  float *pfVar10;
  float *pfVar11;
  size_t sVar12;
  bool bVar13;
  bool bVar14;
  vw_exception *this_00;
  example *peVar15;
  uint uVar16;
  uint32_t uVar17;
  size_t k;
  size_t k_1;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  float fVar22;
  float fVar23;
  uint local_20c;
  multi_ex ec_seq;
  string local_1d8;
  stringstream __msg;
  ostream local_1a8;
  
  ppeVar3 = (ec_seq_all->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((ec_seq_all->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppeVar3) {
    data->ft_offset = ((*ppeVar3)->super_example_predict).ft_offset;
    process_labels(&ec_seq,data,ec_seq_all);
    ppeVar3 = ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar18 = (long)ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
    if (lVar18 != 0) {
      bVar13 = ec_seq_has_label_definition(&ec_seq);
      if (bVar13) {
        std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
        std::operator<<(&local_1a8,"error: label definition encountered in data block");
        this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (this_00,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/csoaa.cc"
                   ,0x1b6,&local_1d8);
        __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      bVar13 = COST_SENSITIVE::ec_is_example_header(*ppeVar3);
      uVar19 = lVar18 >> 3;
      uVar16 = 0;
      if (bVar13) {
        uVar16 = 1;
        for (uVar21 = 1; uVar21 < (uVar19 & 0xffffffff); uVar21 = uVar21 + 1) {
          LabelDict::add_example_namespaces_from_example
                    (ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar21],
                     *ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
        }
      }
      uVar21 = (ulong)uVar16;
      bVar14 = test_ldf_sequence(data,uVar21,&ec_seq);
      local_20c = uVar16;
      if (data->rank == false) {
        fVar23 = 3.4028235e+38;
        for (uVar20 = uVar21; uVar20 < (uVar19 & 0xffffffff); uVar20 = uVar20 + 1) {
          peVar15 = ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar20];
          make_single_prediction(data,base,peVar15);
          fVar22 = peVar15->partial_prediction;
          if (fVar22 < fVar23) {
            local_20c = (uint)uVar20;
            fVar23 = fVar22;
          }
        }
      }
      else {
        v_array<ACTION_SCORE::action_score>::clear(&data->a_s);
        this = &data->stored_preds;
        v_array<v_array<ACTION_SCORE::action_score>_>::clear(this);
        if (bVar13) {
          v_array<v_array<ACTION_SCORE::action_score>_>::push_back
                    (this,(v_array<ACTION_SCORE::action_score> *)
                          &((*ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>.
                              _M_impl.super__Vector_impl_data._M_start)->pred).scalars);
        }
        uVar17 = 0;
        for (uVar20 = uVar21; uVar20 < (uVar19 & 0xffffffff); uVar20 = uVar20 + 1) {
          v_array<v_array<ACTION_SCORE::action_score>_>::push_back
                    (this,(v_array<ACTION_SCORE::action_score> *)
                          &(ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl
                            .super__Vector_impl_data._M_start[uVar20]->pred).scalars);
          make_single_prediction
                    (data,base,
                     ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar20]);
          ___msg = uVar17;
          v_array<ACTION_SCORE::action_score>::push_back(&data->a_s,(action_score *)&__msg);
          uVar17 = uVar17 + 1;
        }
        paVar4 = (data->a_s)._begin;
        qsort(paVar4,(long)(data->a_s)._end - (long)paVar4 >> 3,8,ACTION_SCORE::score_comp);
      }
      if (!bVar14) {
        if (data->is_wap == true) {
          do_actual_learning_wap(data,base,uVar21,&ec_seq);
        }
        else {
          do_actual_learning_oaa(data,base,uVar21,&ec_seq);
        }
      }
      if (data->rank == false) {
        for (uVar20 = uVar21; uVar20 < (uVar19 & 0xffffffff); uVar20 = uVar20 + 1) {
          if (local_20c == uVar20) {
            peVar15 = ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                      super__Vector_impl_data._M_start[local_20c];
            fVar23 = (float)((peVar15->l).cs.costs._begin)->class_index;
          }
          else {
            peVar15 = ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar20];
            fVar23 = 0.0;
          }
          (peVar15->pred).scalar = fVar23;
        }
      }
      else {
        v_array<ACTION_SCORE::action_score>::clear((data->stored_preds)._begin);
        if (bVar13) {
          pvVar5 = (data->stored_preds)._begin;
          peVar15 = *ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          paVar4 = pvVar5->_begin;
          paVar9 = pvVar5->_end;
          uVar6 = *(undefined4 *)((long)&pvVar5->end_array + 4);
          sVar12 = pvVar5->erase_count;
          uVar7 = *(undefined4 *)((long)&pvVar5->erase_count + 4);
          *(undefined4 *)((long)&peVar15->pred + 0x10) = *(undefined4 *)&pvVar5->end_array;
          *(undefined4 *)((long)&peVar15->pred + 0x14) = uVar6;
          *(int *)((long)&peVar15->pred + 0x18) = (int)sVar12;
          *(undefined4 *)((long)&peVar15->pred + 0x1c) = uVar7;
          (peVar15->pred).scalars._begin = (float *)paVar4;
          (peVar15->pred).scalars._end = (float *)paVar9;
        }
        lVar18 = 0;
        for (uVar20 = uVar21; uVar20 < (uVar19 & 0xffffffff); uVar20 = uVar20 + 1) {
          pvVar5 = (data->stored_preds)._begin;
          peVar15 = ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar20];
          puVar1 = (undefined8 *)((long)&pvVar5->_begin + lVar18 * 4 + (ulong)(uVar16 << 5));
          pfVar10 = (float *)*puVar1;
          pfVar11 = (float *)puVar1[1];
          puVar2 = (undefined4 *)((long)&pvVar5->end_array + lVar18 * 4 + (ulong)(uVar16 << 5));
          uVar6 = puVar2[1];
          uVar7 = puVar2[2];
          uVar8 = puVar2[3];
          *(undefined4 *)((long)&peVar15->pred + 0x10) = *puVar2;
          *(undefined4 *)((long)&peVar15->pred + 0x14) = uVar6;
          *(undefined4 *)((long)&peVar15->pred + 0x18) = uVar7;
          *(undefined4 *)((long)&peVar15->pred + 0x1c) = uVar8;
          (peVar15->pred).scalars._begin = pfVar10;
          (peVar15->pred).scalars._end = pfVar11;
          v_array<ACTION_SCORE::action_score>::push_back
                    ((v_array<ACTION_SCORE::action_score> *)
                     &((*ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                         super__Vector_impl_data._M_start)->pred).scalars,
                     (action_score *)((long)&((data->a_s)._begin)->action + lVar18));
          lVar18 = lVar18 + 8;
        }
      }
      if (bVar13) {
        for (uVar20 = 1; uVar20 < (uVar19 & 0xffffffff); uVar20 = uVar20 + 1) {
          LabelDict::del_example_namespaces_from_example
                    (ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar20],
                     *ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
        }
      }
      if (data->is_probabilities == true) {
        fVar23 = 0.0;
        for (uVar20 = uVar21; uVar20 < (uVar19 & 0xffffffff); uVar20 = uVar20 + 1) {
          fVar22 = expf(ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar20]->partial_prediction);
          fVar22 = 1.0 / (fVar22 + 1.0);
          (ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
           super__Vector_impl_data._M_start[uVar20]->pred).scalar = fVar22;
          fVar23 = fVar23 + fVar22;
        }
        for (; uVar21 < (uVar19 & 0xffffffff); uVar21 = uVar21 + 1) {
          (ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
           super__Vector_impl_data._M_start[uVar21]->pred).scalar =
               (ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                super__Vector_impl_data._M_start[uVar21]->pred).scalar / fVar23;
        }
      }
    }
    std::_Vector_base<example_*,_std::allocator<example_*>_>::~_Vector_base
              (&ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>);
  }
  return;
}

Assistant:

void do_actual_learning(ldf& data, single_learner& base, multi_ex& ec_seq_all)
{
  if (ec_seq_all.size() == 0)
    return;  // nothing to do

  data.ft_offset = ec_seq_all[0]->ft_offset;

  // handle label definitions
  auto ec_seq = process_labels(data, ec_seq_all);
  if (ec_seq.size() == 0)
    return;  // nothing more to do

  // Ensure there are no more labels
  // (can be done in existing loops later but as a side effect learning
  //    will happen with bad example)
  if (ec_seq_has_label_definition(ec_seq))
  {
    THROW("error: label definition encountered in data block");
  }

  /////////////////////// add headers
  uint32_t K = (uint32_t)ec_seq.size();
  uint32_t start_K = 0;

  if (ec_is_example_header(*ec_seq[0]))
  {
    start_K = 1;
    for (uint32_t k = 1; k < K; k++) LabelDict::add_example_namespaces_from_example(*ec_seq[k], *ec_seq[0]);
  }
  bool isTest = test_ldf_sequence(data, start_K, ec_seq);
  /////////////////////// do prediction
  uint32_t predicted_K = start_K;
  if (data.rank)
  {
    data.a_s.clear();
    data.stored_preds.clear();
    if (start_K > 0)
      data.stored_preds.push_back(ec_seq[0]->pred.a_s);
    for (uint32_t k = start_K; k < K; k++)
    {
      data.stored_preds.push_back(ec_seq[k]->pred.a_s);
      example* ec = ec_seq[k];
      make_single_prediction(data, base, *ec);
      action_score s;
      s.score = ec->partial_prediction;
      s.action = k - start_K;
      data.a_s.push_back(s);
    }

    qsort((void*)data.a_s.begin(), data.a_s.size(), sizeof(action_score), score_comp);
  }
  else
  {
    float min_score = FLT_MAX;
    for (uint32_t k = start_K; k < K; k++)
    {
      example* ec = ec_seq[k];
      make_single_prediction(data, base, *ec);
      if (ec->partial_prediction < min_score)
      {
        min_score = ec->partial_prediction;
        predicted_K = k;
      }
    }
  }

  /////////////////////// learn
  if (is_learn && !isTest)
  {
    if (data.is_wap)
      do_actual_learning_wap(data, base, start_K, ec_seq);
    else
      do_actual_learning_oaa(data, base, start_K, ec_seq);
  }

  if (data.rank)
  {
    data.stored_preds[0].clear();
    if (start_K > 0)
    {
      ec_seq[0]->pred.a_s = data.stored_preds[0];
    }
    for (size_t k = start_K; k < K; k++)
    {
      ec_seq[k]->pred.a_s = data.stored_preds[k];
      ec_seq[0]->pred.a_s.push_back(data.a_s[k - start_K]);
    }
  }
  else
  {
    // Mark the predicted subexample with its class_index, all other with 0
    for (size_t k = start_K; k < K; k++)
    {
      if (k == predicted_K)
        ec_seq[k]->pred.multiclass = ec_seq[k]->l.cs.costs[0].class_index;
      else
        ec_seq[k]->pred.multiclass = 0;
    }
  }
  /////////////////////// remove header
  if (start_K > 0)
    for (size_t k = 1; k < K; k++) LabelDict::del_example_namespaces_from_example(*ec_seq[k], *ec_seq[0]);

  ////////////////////// compute probabilities
  if (data.is_probabilities)
  {
    float sum_prob = 0;
    for (size_t k = start_K; k < K; k++)
    {
      // probability(correct_class) = 1 / (1+exp(-score)), where score is higher for better classes,
      // but partial_prediction is lower for better classes (we are predicting the cost),
      // so we need to take score = -partial_prediction,
      // thus probability(correct_class) = 1 / (1+exp(-(-partial_prediction)))
      float prob = 1.f / (1.f + correctedExp(ec_seq[k]->partial_prediction));
      ec_seq[k]->pred.prob = prob;
      sum_prob += prob;
    }
    // make sure that the probabilities sum up (exactly) to one
    for (size_t k = start_K; k < K; k++)
    {
      ec_seq[k]->pred.prob /= sum_prob;
    }
  }
}